

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

void * map_remove(Map *map,void *key)

{
  List *list;
  int i;
  uint index;
  long *unaff_R13;
  void *pvVar1;
  
  pvVar1 = (void *)0x0;
  list = (List *)map->elem[(ulong)key % (ulong)map->prime];
  if (list != (List *)0x0) {
    for (index = 0; index < list->size; index = index + 1) {
      unaff_R13 = (long *)list_get(list,index);
      if (unaff_R13 == (long *)0x0) {
        return (void *)0x0;
      }
      if ((void *)*unaff_R13 == key) {
        list_remove(list,index);
        break;
      }
    }
    pvVar1 = (void *)unaff_R13[1];
    free(unaff_R13);
    map->size = map->size - 1;
  }
  return pvVar1;
}

Assistant:

void *map_remove(Map *map, void *key) {
    List *els = map_get_(map, key);
    if (els == NULL)return NULL;
    Elem *elem;
    for (int i = 0; i < els->size; ++i) {
        elem = list_get(els, i);
        if (elem == NULL)return NULL;
        if (hash(elem->key) == hash(key)) {
            list_remove(els, i);
            break;
        }
    }
    void *value = elem->value;
    free(elem);
    map->size--;
    return value;
}